

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

optional<unsigned_int> convert_gram(IndexType type,uint64_t source)

{
  size_t __n;
  TrigramGenerator p_Var1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> mem;
  uint *local_88;
  uint *puStack_80;
  long local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  __n = get_ngram_size_for(type);
  local_78 = 0;
  local_88 = (uint *)0x0;
  puStack_80 = (uint *)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uint8_t *)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_68,__n);
  lVar3 = __n * 8 + -8;
  do {
    local_50._M_pod_data[0] = (char)(source >> ((byte)lVar3 & 0x3f));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&local_68,(uchar *)local_50._M_pod_data);
    lVar3 = lVar3 + -8;
  } while (lVar3 != -8);
  p_Var1 = get_generator_for(type);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Utils.cpp:79:27)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/libursa/Utils.cpp:79:27)>
             ::_M_manager;
  local_50._M_unused._M_object = &local_88;
  (*p_Var1)(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,__n,(TrigramCallback *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_88 == puStack_80) {
    uVar4 = 0;
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)*local_88;
    uVar4 = 0x100000000;
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88 != (uint *)0x0) {
    operator_delete(local_88,local_78 - (long)local_88);
  }
  return (_Optional_base<unsigned_int,_true,_true>)
         (_Optional_base<unsigned_int,_true,_true>)(uVar2 | uVar4);
}

Assistant:

std::optional<TriGram> convert_gram(IndexType type, uint64_t source) {
    int size = get_ngram_size_for(type);
    std::vector<TriGram> result;
    std::vector<uint8_t> mem;
    mem.reserve(size);
    for (int i = 0; i < size; i++) {
        mem.push_back(((source) >> ((size - i - 1) * 8)) & 0xFF);
    }
    get_generator_for(type)(
        mem.data(), size, [&result](uint32_t gram) { result.push_back(gram); });
    if (result.empty()) {
        return std::nullopt;
    }
    return std::make_optional(result[0]);
}